

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O0

void SelectiveBranchingMT::initialize(search *sch,size_t *param_2,options_i *options)

{
  typed_option<unsigned_long> *this;
  task_data *data;
  undefined8 *in_RDX;
  search *in_RDI;
  task_data *d;
  option_group_definition new_options;
  size_t kbest;
  size_t max_branches;
  typed_option<unsigned_long> *in_stack_fffffffffffffbe8;
  typed_option<unsigned_long> *in_stack_fffffffffffffbf0;
  string *in_stack_fffffffffffffbf8;
  allocator *paVar1;
  typed_option<unsigned_long> *in_stack_fffffffffffffc00;
  typed_option<unsigned_long> *op;
  option_group_definition *in_stack_fffffffffffffc40;
  allocator local_3b1;
  size_t in_stack_fffffffffffffc50;
  size_t in_stack_fffffffffffffc58;
  task_data *in_stack_fffffffffffffc60;
  allocator local_389;
  string local_388 [359];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [375];
  undefined1 local_81 [33];
  undefined1 local_60 [56];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  search *local_8;
  
  local_20 = 2;
  local_28 = 0;
  op = (typed_option<unsigned_long> *)local_81;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_81 + 1),"selective branching options",(allocator *)op);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffbf0,
             (string *)in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"search_max_branch",&local_1f9);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffbf8,(unsigned_long *)in_stack_fffffffffffffbf0);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffffc00,(unsigned_long)in_stack_fffffffffffffbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"maximum number of branches to consider",&local_221);
  VW::config::typed_option<unsigned_long>::help
            (in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
  VW::config::typed_option<unsigned_long>::typed_option
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  VW::config::option_group_definition::add<unsigned_long>(in_stack_fffffffffffffc40,op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"search_kbest",&local_389);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffbf8,(unsigned_long *)in_stack_fffffffffffffbf0);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffffc00,(unsigned_long)in_stack_fffffffffffffbf8);
  paVar1 = &local_3b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffc50,
             "number of best items to output (0=just like non-selectional-branching, default)",
             paVar1);
  this = VW::config::typed_option<unsigned_long>::help
                   (in_stack_fffffffffffffbf0,(string *)in_stack_fffffffffffffbe8);
  VW::config::typed_option<unsigned_long>::typed_option(this,in_stack_fffffffffffffbe8);
  VW::config::option_group_definition::add<unsigned_long>(in_stack_fffffffffffffc40,op);
  VW::config::typed_option<unsigned_long>::~typed_option(this);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc50);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  VW::config::typed_option<unsigned_long>::~typed_option(this);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  VW::config::typed_option<unsigned_long>::~typed_option(this);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<unsigned_long>::~typed_option(this);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (**(code **)*local_18)(local_18,local_60);
  data = (task_data *)operator_new(0x90);
  task_data::task_data
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
  Search::search::set_metatask_data<SelectiveBranchingMT::task_data>(local_8,data);
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)this);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  size_t max_branches = 2;
  size_t kbest = 0;
  option_group_definition new_options("selective branching options");
  new_options
      .add(make_option("search_max_branch", max_branches)
               .default_value(2)
               .help("maximum number of branches to consider"))
      .add(make_option("search_kbest", kbest)
               .default_value(0)
               .help("number of best items to output (0=just like non-selectional-branching, default)"));
  options.add_and_parse(new_options);

  task_data* d = new task_data(max_branches, kbest);
  sch.set_metatask_data(d);
}